

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

NodePtr avro::makeNode(Entity *e,SymbolTable *st,string *ns)

{
  EntityType EVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  shared_count sVar2;
  Entity *in_RSI;
  element_type *in_RDI;
  NodePtr NVar3;
  string *in_stack_000000b8;
  SymbolTable *in_stack_000000c0;
  string *in_stack_000000c8;
  string *in_stack_00000130;
  SymbolTable *in_stack_00000138;
  Object *in_stack_00000140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  Entity *in_stack_fffffffffffffea0;
  format *in_stack_fffffffffffffed8;
  Exception *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffef0;
  SymbolTable *in_stack_fffffffffffffef8;
  Array *in_stack_ffffffffffffff00;
  Entity *in_stack_ffffffffffffff08;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  Entity *in_stack_ffffffffffffff78;
  
  EVar1 = json::Entity::type(in_RSI);
  if (EVar1 == etString) {
    json::Entity::stringValue_abi_cxx11_(in_stack_fffffffffffffea0);
    NVar3 = makeNode(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
    sVar2 = NVar3.pn.pi_;
  }
  else if (EVar1 == etArray) {
    json::Entity::arrayValue(in_stack_fffffffffffffea0);
    NVar3 = makeNode(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0);
    sVar2 = NVar3.pn.pi_;
  }
  else {
    if (EVar1 != etObject) {
      this = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x18);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
      json::Entity::toString_abi_cxx11_(in_stack_ffffffffffffff78);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                (this,in_stack_fffffffffffffe98);
      Exception::Exception(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
    }
    json::Entity::objectValue_abi_cxx11_(in_stack_fffffffffffffea0);
    NVar3 = makeNode((Entity *)ns,in_stack_00000140,in_stack_00000138,in_stack_00000130);
    sVar2 = NVar3.pn.pi_;
  }
  NVar3.pn.pi_ = sVar2.pi_;
  NVar3.px = in_RDI;
  return NVar3;
}

Assistant:

static NodePtr makeNode(const json::Entity& e, SymbolTable& st, const string& ns)
{
    switch (e.type()) {
    case json::etString:
        return makeNode(e.stringValue(), st, ns);
    case json::etObject:
        return makeNode(e, e.objectValue(), st, ns);
    case json::etArray:
        return makeNode(e, e.arrayValue(), st, ns);
    default:
        throw Exception(boost::format("Invalid Avro type: %1%") % e.toString());
    }
}